

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
node::anon_unknown_2::ChainImpl::findAncestorByHash
          (ChainImpl *this,uint256 *block_hash,uint256 *ancestor_hash,FoundBlock *ancestor_out)

{
  bool bVar1;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar2;
  CBlockIndex *pCVar3;
  CBlockIndex *index;
  Chainstate *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lock;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &cs_main.super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  pCVar3 = BlockManager::LookupBlockIndex
                     (&((puVar2->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman
                      ,block_hash);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  index = BlockManager::LookupBlockIndex
                    (&((puVar2->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman,
                     ancestor_hash);
  if ((pCVar3 != (CBlockIndex *)0x0) && (index != (CBlockIndex *)0x0)) {
    pCVar3 = CBlockIndex::GetAncestor(pCVar3,index->nHeight);
    if (pCVar3 != index) {
      index = (CBlockIndex *)0x0;
    }
  }
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar2->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar2 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_node->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x35d,"chainman","m_node.chainman");
  bVar1 = FillBlock(index,ancestor_out,
                    (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_38,&pCVar4->m_chain,
                    &((puVar2->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_blockman);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool findAncestorByHash(const uint256& block_hash, const uint256& ancestor_hash, const FoundBlock& ancestor_out) override
    {
        WAIT_LOCK(cs_main, lock);
        const CBlockIndex* block = chainman().m_blockman.LookupBlockIndex(block_hash);
        const CBlockIndex* ancestor = chainman().m_blockman.LookupBlockIndex(ancestor_hash);
        if (block && ancestor && block->GetAncestor(ancestor->nHeight) != ancestor) ancestor = nullptr;
        return FillBlock(ancestor, ancestor_out, lock, chainman().ActiveChain(), chainman().m_blockman);
    }